

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::anon_unknown_0::
StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>::Finalize
          (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *this,
          CordRepBtree *tree,OpResult result)

{
  int iVar1;
  char *absl_raw_log_internal_basename;
  CordRepBtree *tree_local;
  OpResult result_local;
  
  iVar1 = (int)result.tree;
  result_local._8_8_ = tree;
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      CordRep::Unref((CordRep *)this);
    }
    else {
      if (iVar1 != 2) {
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                      ,0x121,
                      "static CordRepBtree *absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kBack>::Finalize(CordRepBtree *, OpResult) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                     );
      }
      absl_raw_log_internal_basename = (char *)CordRepBtree::New((CordRepBtree *)this,tree);
      iVar1 = CordRepBtree::height((CordRepBtree *)absl_raw_log_internal_basename);
      if (0xb < iVar1) {
        absl_raw_log_internal_basename =
             (char *)CordRepBtree::Rebuild((CordRepBtree *)absl_raw_log_internal_basename);
        iVar1 = CordRepBtree::height((CordRepBtree *)absl_raw_log_internal_basename);
        if (0xb < iVar1) {
          raw_log_internal::RawLog
                    (kFatal,"cord_rep_btree.cc",0x118,"Check %s failed: %s",
                     "tree->height() <= CordRepBtree::kMaxHeight","Max height exceeded");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                        ,0x118,
                        "static CordRepBtree *absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kBack>::Finalize(CordRepBtree *, OpResult) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                       );
        }
      }
      result_local._8_8_ = absl_raw_log_internal_basename;
    }
  }
  return (CordRepBtree *)result_local._8_8_;
}

Assistant:

static inline CordRepBtree* Finalize(CordRepBtree* tree, OpResult result) {
    switch (result.action) {
      case CordRepBtree::kPopped:
        tree = edge_type == kBack ? CordRepBtree::New(tree, result.tree)
                                  : CordRepBtree::New(result.tree, tree);
        if (ABSL_PREDICT_FALSE(tree->height() > CordRepBtree::kMaxHeight)) {
          tree = CordRepBtree::Rebuild(tree);
          ABSL_RAW_CHECK(tree->height() <= CordRepBtree::kMaxHeight,
                         "Max height exceeded");
        }
        return tree;
      case CordRepBtree::kCopied:
        CordRep::Unref(tree);
        ABSL_FALLTHROUGH_INTENDED;
      case CordRepBtree::kSelf:
        return result.tree;
    }
    ABSL_UNREACHABLE();
    return result.tree;
  }